

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaxi.c
# Opt level: O3

Vec_Int_t * Gia_ManMaxiPerform(Gia_Man_t *p,Vec_Int_t *vInit,int nFrames,int nTimeOut,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Gia_Man_t *pGVar7;
  Gia_Man_t *pGVar8;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  sat_solver *psVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  Vec_Int_t *pVVar12;
  void *__s;
  int iVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  abctime aVar17;
  long lVar18;
  ulong uVar19;
  Vec_Int_t *pVVar20;
  ulong uVar21;
  size_t __size;
  timespec ts;
  timespec local_78;
  Vec_Int_t *local_68;
  Gia_Man_t *local_60;
  uint local_54;
  sat_solver *local_50;
  Gia_Man_t *local_48;
  long local_40;
  long local_38;
  
  local_68 = vInit;
  local_54 = nTimeOut;
  iVar3 = clock_gettime(3,&local_78);
  pVVar10 = local_68;
  if (iVar3 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  pGVar7 = Gia_ManMaxiUnfold(p,nFrames,0,local_68);
  pGVar8 = Gia_ManMaxiUnfold(p,nFrames,1,pVVar10);
  local_48 = p;
  local_60 = Gia_ManMiter(pGVar7,pGVar8,0,0,0,0,0);
  pAig = Gia_ManToAigSimple(local_60);
  pAig->nRegs = 0;
  p_00 = Cnf_Derive(pAig,pAig->nObjs[3]);
  Aig_ManStop(pAig);
  Gia_ManStop(pGVar7);
  pGVar7 = local_48;
  Gia_ManStop(pGVar8);
  uVar4 = local_54;
  if (pGVar7->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaxi.c"
                  ,0x98,"Vec_Int_t *Gia_ManMaxiPerform(Gia_Man_t *, Vec_Int_t *, int, int, int)");
  }
  if (fVerbose != 0) {
    pcVar15 = "";
    if (local_68 == (Vec_Int_t *)0x0) {
      pcVar15 = "no ";
    }
    printf("Running with %d frames and %sgiven init state.\n",(ulong)(uint)nFrames,pcVar15);
  }
  psVar9 = sat_solver_new();
  sat_solver_setnvars(psVar9,p_00->nVars);
  if (uVar4 == 0) {
    aVar17 = 0;
  }
  else {
    iVar3 = clock_gettime(3,&local_78);
    if (iVar3 < 0) {
      lVar16 = -1;
    }
    else {
      lVar16 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    aVar17 = lVar16 + (long)(int)uVar4 * 1000000;
  }
  psVar9->nRuntimeLimit = aVar17;
  lVar16 = 0;
  while (lVar16 < p_00->nClauses) {
    iVar3 = sat_solver_addclause(psVar9,p_00->pClauses[lVar16],p_00->pClauses[lVar16 + 1]);
    lVar16 = lVar16 + 1;
    if (iVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaxi.c"
                    ,0xa1,"Vec_Int_t *Gia_ManMaxiPerform(Gia_Man_t *, Vec_Int_t *, int, int, int)");
    }
  }
  iVar3 = pGVar7->vCos->nSize;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar5 = iVar3;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = iVar5;
  if (iVar5 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc((long)iVar5 << 2);
  }
  pVVar10->pArray = piVar11;
  pVVar12 = local_60->vCos;
  if (pVVar12->nSize < 1) {
    lVar16 = 0;
  }
  else {
    lVar16 = 0;
    do {
      iVar3 = pVVar12->pArray[lVar16];
      if (((long)iVar3 < 0) || (local_60->nObjs <= iVar3)) goto LAB_005b3ebb;
      if (local_60->pObjs == (Gia_Obj_t *)0x0) break;
      if (p_00->pVarNums[iVar3] < 0) goto LAB_005b3f37;
      Vec_IntPush(pVVar10,p_00->pVarNums[iVar3] * 2);
      lVar16 = lVar16 + 1;
      pVVar12 = local_60->vCos;
    } while (lVar16 < pVVar12->nSize);
    piVar11 = pVVar10->pArray;
    lVar16 = (long)pVVar10->nSize;
  }
  sat_solver_addclause(psVar9,piVar11,piVar11 + lVar16);
  pVVar10->nSize = 0;
  iVar3 = local_60->nRegs;
  pVVar12 = local_60->vCis;
  iVar5 = pVVar12->nSize;
  if (iVar3 < iVar5) {
    uVar21 = 0;
    pGVar8 = local_60;
    pVVar20 = local_68;
    do {
      if ((long)iVar5 <= (long)uVar21) goto LAB_005b3eda;
      iVar5 = pVVar12->pArray[uVar21];
      if (((long)iVar5 < 0) || (pGVar8->nObjs <= iVar5)) goto LAB_005b3ebb;
      if ((pGVar8->pObjs == (Gia_Obj_t *)0x0) || (uVar21 == (uint)pGVar7->nRegs)) break;
      if ((long)pVVar20->nSize <= (long)uVar21) goto LAB_005b3eda;
      if ((uint)pVVar20->pArray[uVar21] < 2) {
        if (p_00->pVarNums[iVar5] < 0) {
LAB_005b3f37:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        Vec_IntPush(pVVar10,p_00->pVarNums[iVar5] * 2 + 1);
        iVar3 = local_60->nRegs;
        pVVar12 = local_60->vCis;
        pGVar8 = local_60;
        pVVar20 = local_68;
      }
      uVar21 = uVar21 + 1;
      iVar5 = pVVar12->nSize;
    } while ((long)uVar21 < (long)(iVar5 - iVar3));
  }
  local_40 = lVar14;
  if (fVerbose != 0) {
    printf("Iter%6d : ",0);
    uVar4 = sat_solver_nvars(psVar9);
    printf("Var =%10d  ",(ulong)uVar4);
    uVar4 = sat_solver_nclauses(psVar9);
    printf("Clause =%10d  ",(ulong)uVar4);
    uVar4 = sat_solver_nconflicts(psVar9);
    printf("Conflict =%10d  ",(ulong)uVar4);
    iVar3 = 0x9f9729;
    printf("Subset =%6d  ",(ulong)(uint)pVVar10->nSize);
    Abc_Print(iVar3,"%s =","Time");
    Abc_Print(iVar3,"%9.2f sec\n",0);
  }
  uVar4 = 0;
  lVar14 = 0;
  local_50 = psVar9;
  do {
    psVar9 = local_50;
    iVar3 = clock_gettime(3,&local_78);
    if (iVar3 < 0) {
      lVar16 = 1;
    }
    else {
      lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
      lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_78.tv_sec * -1000000;
    }
    local_38 = (long)pVVar10->nSize;
    iVar3 = sat_solver_solve(psVar9,pVVar10->pArray,pVVar10->pArray + local_38,0,0,0,0);
    iVar5 = clock_gettime(3,&local_78);
    psVar9 = local_50;
    if (iVar5 < 0) {
      lVar18 = -1;
    }
    else {
      lVar18 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    if (iVar3 != -1) {
      if (iVar3 == 1) {
        printf("The problem is SAT after %d iterations.  ");
      }
      else {
        if (iVar3 != 0) {
          __assert_fail("status == l_False",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaxi.c"
                        ,0xce,
                        "Vec_Int_t *Gia_ManMaxiPerform(Gia_Man_t *, Vec_Int_t *, int, int, int)");
        }
        printf("Timeout reached after %d seconds and %d iterations.  ",(ulong)local_54,(ulong)uVar4)
        ;
      }
      break;
    }
    lVar14 = lVar14 + lVar16 + lVar18;
    uVar1 = (local_50->conf_final).size;
    piVar11 = (local_50->conf_final).ptr;
    if (fVerbose != 0) {
      printf("Iter%6d : ",(ulong)(uVar4 + 1));
      uVar6 = sat_solver_nvars(psVar9);
      printf("Var =%10d  ",(ulong)uVar6);
      uVar6 = sat_solver_nclauses(psVar9);
      printf("Clause =%10d  ",(ulong)uVar6);
      uVar6 = sat_solver_nconflicts(psVar9);
      printf("Conflict =%10d  ",(ulong)uVar6);
      iVar3 = 0x9f9729;
      printf("Subset =%6d  ",(ulong)uVar1);
      Abc_Print(iVar3,"%s =","Time");
      Abc_Print(iVar3,"%9.2f sec\n",(double)lVar14 / 1000000.0);
    }
    if ((uint)local_38 == uVar1) {
      printf("Reached fixed point with %d entries after %d iterations.  ",local_38,
             (ulong)(uVar4 + 1));
      break;
    }
    pVVar10->nSize = 0;
    if (0 < (int)uVar1) {
      uVar21 = 0;
      do {
        uVar6 = piVar11[uVar21];
        if ((int)uVar6 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x131,"int Abc_LitNot(int)");
        }
        Vec_IntPush(pVVar10,uVar6 ^ 1);
        uVar21 = uVar21 + 1;
      } while (uVar1 != uVar21);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 1000000);
  iVar3 = p_00->nVars;
  iVar5 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar5 = iVar3;
  }
  if ((iVar5 == 0) || (__s = malloc((long)iVar5 << 2), __s == (void *)0x0)) {
    __s = (void *)0x0;
  }
  else {
    memset(__s,0,(long)iVar3 * 4);
  }
  iVar5 = pVVar10->nSize;
  piVar11 = pVVar10->pArray;
  if ((long)iVar5 < 1) {
    if (piVar11 == (int *)0x0) goto LAB_005b3ccd;
  }
  else {
    lVar14 = 0;
    do {
      if (piVar11[lVar14] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar4 = (uint)piVar11[lVar14] >> 1;
      if (iVar3 <= (int)uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)((long)__s + (ulong)uVar4 * 4) = 1;
      lVar14 = lVar14 + 1;
    } while (iVar5 != lVar14);
  }
  free(piVar11);
LAB_005b3ccd:
  free(pVVar10);
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  uVar4 = local_68->nSize;
  pVVar10->nSize = uVar4;
  pVVar10->nCap = uVar4;
  if ((long)(int)uVar4 == 0) {
    __size = 0;
    piVar11 = (int *)0x0;
  }
  else {
    __size = (long)(int)uVar4 * 4;
    piVar11 = (int *)malloc(__size);
  }
  pVVar10->pArray = piVar11;
  memcpy(piVar11,local_68->pArray,__size);
  pVVar12 = local_60->vCis;
  iVar5 = local_60->nRegs;
  iVar13 = pVVar12->nSize;
  if (iVar5 < iVar13) {
    uVar19 = 0;
    uVar21 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar21 = uVar19;
    }
LAB_005b3d50:
    if ((long)iVar13 <= (long)uVar19) {
LAB_005b3eda:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar2 = pVVar12->pArray[uVar19];
    if (((long)iVar2 < 0) || (local_60->nObjs <= iVar2)) {
LAB_005b3ebb:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if ((local_60->pObjs != (Gia_Obj_t *)0x0) && (uVar19 != (uint)local_48->nRegs)) {
      if (uVar21 == uVar19) goto LAB_005b3eda;
      if ((uint)piVar11[uVar19] < 2) {
        iVar2 = p_00->pVarNums[iVar2];
        if (((long)iVar2 < 0) || (iVar3 <= iVar2)) goto LAB_005b3eda;
        if (*(int *)((long)__s + (long)iVar2 * 4) == 0) {
          piVar11[uVar19] = piVar11[uVar19] | 2;
          iVar13 = pVVar12->nSize;
        }
      }
      uVar19 = uVar19 + 1;
      if ((long)uVar19 < (long)(iVar13 - iVar5)) goto LAB_005b3d50;
    }
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  sat_solver_delete(local_50);
  Cnf_DataFree(p_00);
  Gia_ManStop(local_60);
  iVar5 = 3;
  iVar3 = clock_gettime(3,&local_78);
  if (iVar3 < 0) {
    lVar14 = -1;
  }
  else {
    lVar14 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
  }
  lVar14 = lVar14 + local_40;
  Abc_Print(iVar5,"%s =","Total runtime");
  Abc_Print(iVar5,"%9.2f sec\n",(double)lVar14 / 1000000.0);
  return pVVar10;
}

Assistant:

Vec_Int_t * Gia_ManMaxiPerform( Gia_Man_t * p, Vec_Int_t * vInit, int nFrames, int nTimeOut, int fVerbose )
{
    int nIterMax = 1000000;
    int i, iLit, Iter, status;
    int nLits, * pLits;
    abctime clkTotal = Abc_Clock();
    abctime clkSat = 0;
    Vec_Int_t * vLits, * vMap;
    sat_solver * pSat;
    Gia_Obj_t * pObj;
    Gia_Man_t * p0 = Gia_ManMaxiUnfold( p, nFrames, 0, vInit );
    Gia_Man_t * p1 = Gia_ManMaxiUnfold( p, nFrames, 1, vInit );
    Gia_Man_t * pM = Gia_ManMiter( p0, p1, 0, 0, 0, 0, 0 );
    Cnf_Dat_t * pCnf = Cnf_DeriveGiaRemapped( pM );
    Gia_ManStop( p0 );
    Gia_ManStop( p1 );
    assert( Gia_ManRegNum(p) > 0 );
    if ( fVerbose )
        printf( "Running with %d frames and %sgiven init state.\n", nFrames, vInit ? "":"no " );

    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pCnf->nVars );
    sat_solver_set_runtime_limit( pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            assert( 0 );

    // add one large OR clause
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( pM, pObj, i )
        Vec_IntPush( vLits, Abc_Var2Lit(pCnf->pVarNums[Gia_ObjId(pM, pObj)], 0) );
    sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );

    // create assumptions
    Vec_IntClear( vLits );
    Gia_ManForEachPi( pM, pObj, i )
        if ( i == Gia_ManRegNum(p) )
            break;
        else if ( Vec_IntEntry(vInit, i) == 0 || Vec_IntEntry(vInit, i) == 1 )
            Vec_IntPush( vLits, Abc_Var2Lit(pCnf->pVarNums[Gia_ObjId(pM, pObj)], 1) );

    if ( fVerbose )
    {
        printf( "Iter%6d : ",       0 );
        printf( "Var =%10d  ",      sat_solver_nvars(pSat) );
        printf( "Clause =%10d  ",   sat_solver_nclauses(pSat) );
        printf( "Conflict =%10d  ", sat_solver_nconflicts(pSat) );
        printf( "Subset =%6d  ",    Vec_IntSize(vLits) );
        Abc_PrintTime( 1, "Time", clkSat );
//      ABC_PRTr( "Solver time", clkSat );
    }
    for ( Iter = 0; Iter < nIterMax; Iter++ )
    {
        abctime clk = Abc_Clock();
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        clkSat += Abc_Clock() - clk;
        if ( status == l_Undef )
        {
//            if ( fVerbose )
//                printf( "\n" );
            printf( "Timeout reached after %d seconds and %d iterations.  ", nTimeOut, Iter );
            break;
        }
        if ( status == l_True )
        {
//            if ( fVerbose )
//                printf( "\n" );
            printf( "The problem is SAT after %d iterations.  ", Iter );
            break;
        }
        assert( status == l_False );
        nLits = sat_solver_final( pSat, &pLits );
        if ( fVerbose )
        {
            printf( "Iter%6d : ",       Iter+1 );
            printf( "Var =%10d  ",      sat_solver_nvars(pSat) );
            printf( "Clause =%10d  ",   sat_solver_nclauses(pSat) );
            printf( "Conflict =%10d  ", sat_solver_nconflicts(pSat) );
            printf( "Subset =%6d  ",    nLits );
            Abc_PrintTime( 1, "Time", clkSat );
//            ABC_PRTr( "Solver time", clkSat );
        }
        if ( Vec_IntSize(vLits) == nLits )
        {
//            if ( fVerbose )
//                printf( "\n" );
            printf( "Reached fixed point with %d entries after %d iterations.  ", Vec_IntSize(vLits), Iter+1 );
            break;
        }
        // collect used literals
        Vec_IntClear( vLits );
        for ( i = 0; i < nLits; i++ )
            Vec_IntPush( vLits, Abc_LitNot(pLits[i]) );
    }
    // create map
    vMap = Vec_IntStart( pCnf->nVars );
    Vec_IntForEachEntry( vLits, iLit, i )
        Vec_IntWriteEntry( vMap, Abc_Lit2Var(iLit), 1 );

    // create output
    Vec_IntFree( vLits );
    vLits = Vec_IntDup(vInit);
    Gia_ManForEachPi( pM, pObj, i )
        if ( i == Gia_ManRegNum(p) )
            break;
        else if ( Vec_IntEntry(vLits, i) == 4 || Vec_IntEntry(vLits, i) == 5 )
            Vec_IntWriteEntry( vLits, i, Vec_IntEntry(vLits, i) );
        else if ( (Vec_IntEntry(vLits, i) == 0 || Vec_IntEntry(vLits, i) == 1) && !Vec_IntEntry(vMap, pCnf->pVarNums[Gia_ObjId(pM, pObj)]) )
            Vec_IntWriteEntry( vLits, i, Vec_IntEntry(vLits, i) | 2 );
    Vec_IntFree( vMap );

    // cleanup
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( pM );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    return vLits;
}